

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

SmallVector<spirv_cross::EntryPoint,_8UL> * __thiscall
spirv_cross::Compiler::get_entry_points_and_stages
          (SmallVector<spirv_cross::EntryPoint,_8UL> *__return_storage_ptr__,Compiler *this)

{
  bool bVar1;
  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>_>_>
  *this_00;
  EntryPoint local_68;
  reference local_40;
  value_type *entry;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>_>_>
  *__range1;
  Compiler *this_local;
  SmallVector<spirv_cross::EntryPoint,_8UL> *entries;
  
  SmallVector<spirv_cross::EntryPoint,_8UL>::SmallVector(__return_storage_ptr__);
  this_00 = &(this->ir).entry_points;
  __end1 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>_>_>
           ::begin(this_00);
  entry = (value_type *)
          ::std::
          unordered_map<spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>_>_>
          ::end(this_00);
  while (bVar1 = ::std::__detail::operator!=
                           (&__end1.
                             super__Node_iterator_base<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_true>
                            ,(_Node_iterator_base<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_true>
                              *)&entry), bVar1) {
    local_40 = ::std::__detail::
               _Node_const_iterator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_false,_true>
               ::operator*(&__end1);
    ::std::__cxx11::string::string((string *)&local_68,(string *)&(local_40->second).orig_name);
    local_68.execution_model = (local_40->second).model;
    SmallVector<spirv_cross::EntryPoint,_8UL>::push_back(__return_storage_ptr__,&local_68);
    EntryPoint::~EntryPoint(&local_68);
    ::std::__detail::
    _Node_const_iterator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_false,_true>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

SmallVector<EntryPoint> Compiler::get_entry_points_and_stages() const
{
	SmallVector<EntryPoint> entries;
	for (auto &entry : ir.entry_points)
		entries.push_back({ entry.second.orig_name, entry.second.model });
	return entries;
}